

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  auVar18 = _DAT_005101a0;
  do {
    if (0 < w) {
      lVar19 = 0;
      do {
        auVar21 = *(undefined1 (*) [16])(mask + lVar19);
        auVar30 = *(undefined1 (*) [16])(src0 + lVar19);
        puVar1 = src1 + lVar19;
        auVar28._0_14_ = auVar30._0_14_;
        auVar28[0xe] = auVar30[7];
        auVar28[0xf] = puVar1[7];
        auVar27._14_2_ = auVar28._14_2_;
        auVar27._0_13_ = auVar30._0_13_;
        auVar27[0xd] = puVar1[6];
        auVar29._13_3_ = auVar27._13_3_;
        auVar29._0_12_ = auVar30._0_12_;
        auVar29[0xc] = auVar30[6];
        auVar26._12_4_ = auVar29._12_4_;
        auVar26._0_11_ = auVar30._0_11_;
        auVar26[0xb] = puVar1[5];
        auVar25._11_5_ = auVar26._11_5_;
        auVar25._0_10_ = auVar30._0_10_;
        auVar25[10] = auVar30[5];
        auVar24._10_6_ = auVar25._10_6_;
        auVar24._0_9_ = auVar30._0_9_;
        auVar24[9] = puVar1[4];
        auVar23._9_7_ = auVar24._9_7_;
        auVar23._0_8_ = auVar30._0_8_;
        auVar23[8] = auVar30[4];
        auVar22._8_8_ = auVar23._8_8_;
        auVar22[7] = puVar1[3];
        auVar22[6] = auVar30[3];
        auVar22[5] = puVar1[2];
        auVar22[4] = auVar30[2];
        auVar22[3] = puVar1[1];
        auVar22[2] = auVar30[1];
        auVar22[0] = auVar30[0];
        auVar22[1] = *puVar1;
        auVar38._0_14_ = auVar21._0_14_;
        auVar38[0xe] = auVar21[7];
        auVar38[0xf] = '@' - auVar21[7];
        auVar37._14_2_ = auVar38._14_2_;
        auVar37._0_13_ = auVar21._0_13_;
        auVar37[0xd] = '@' - auVar21[6];
        auVar36._13_3_ = auVar37._13_3_;
        auVar36._0_12_ = auVar21._0_12_;
        auVar36[0xc] = auVar21[6];
        auVar35._12_4_ = auVar36._12_4_;
        auVar35._0_11_ = auVar21._0_11_;
        auVar35[0xb] = '@' - auVar21[5];
        auVar34._11_5_ = auVar35._11_5_;
        auVar34._0_10_ = auVar21._0_10_;
        auVar34[10] = auVar21[5];
        auVar33._10_6_ = auVar34._10_6_;
        auVar33._0_9_ = auVar21._0_9_;
        auVar33[9] = '@' - auVar21[4];
        auVar32._9_7_ = auVar33._9_7_;
        auVar32._0_8_ = auVar21._0_8_;
        auVar32[8] = auVar21[4];
        auVar31._8_8_ = auVar32._8_8_;
        auVar31[7] = '@' - auVar21[3];
        auVar31[6] = auVar21[3];
        auVar31[5] = '@' - auVar21[2];
        auVar31[4] = auVar21[2];
        auVar31[3] = '@' - auVar21[1];
        auVar31[2] = auVar21[1];
        auVar31[1] = '@' - auVar21[0];
        auVar31[0] = auVar21[0];
        auVar29 = pmaddubsw(auVar22,auVar31);
        auVar20[1] = puVar1[8];
        auVar20[0] = auVar30[8];
        auVar20[2] = auVar30[9];
        auVar20[3] = puVar1[9];
        auVar20[4] = auVar30[10];
        auVar20[5] = puVar1[10];
        auVar20[6] = auVar30[0xb];
        auVar20[7] = puVar1[0xb];
        auVar20[8] = auVar30[0xc];
        auVar20[9] = puVar1[0xc];
        auVar20[10] = auVar30[0xd];
        auVar20[0xb] = puVar1[0xd];
        auVar20[0xc] = auVar30[0xe];
        auVar20[0xd] = puVar1[0xe];
        auVar20[0xe] = auVar30[0xf];
        auVar20[0xf] = puVar1[0xf];
        auVar30[1] = '@' - auVar21[8];
        auVar30[0] = auVar21[8];
        auVar30[2] = auVar21[9];
        auVar30[3] = '@' - auVar21[9];
        auVar30[4] = auVar21[10];
        auVar30[5] = '@' - auVar21[10];
        auVar30[6] = auVar21[0xb];
        auVar30[7] = '@' - auVar21[0xb];
        auVar30[8] = auVar21[0xc];
        auVar30[9] = '@' - auVar21[0xc];
        auVar30[10] = auVar21[0xd];
        auVar30[0xb] = '@' - auVar21[0xd];
        auVar30[0xc] = auVar21[0xe];
        auVar30[0xd] = '@' - auVar21[0xe];
        auVar30[0xe] = auVar21[0xf];
        auVar30[0xf] = '@' - auVar21[0xf];
        auVar21 = pmaddubsw(auVar20,auVar30);
        auVar30 = pmulhrsw(auVar29,auVar18);
        auVar21 = pmulhrsw(auVar21,auVar18);
        sVar2 = auVar30._0_2_;
        sVar3 = auVar30._2_2_;
        sVar4 = auVar30._4_2_;
        sVar5 = auVar30._6_2_;
        sVar6 = auVar30._8_2_;
        sVar7 = auVar30._10_2_;
        sVar8 = auVar30._12_2_;
        sVar9 = auVar30._14_2_;
        sVar10 = auVar21._0_2_;
        sVar11 = auVar21._2_2_;
        sVar12 = auVar21._4_2_;
        sVar13 = auVar21._6_2_;
        sVar14 = auVar21._8_2_;
        sVar15 = auVar21._10_2_;
        sVar16 = auVar21._12_2_;
        sVar17 = auVar21._14_2_;
        puVar1 = dst + lVar19;
        *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar30[0] - (0xff < sVar2);
        puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar30[2] - (0xff < sVar3);
        puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar30[4] - (0xff < sVar4);
        puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar30[6] - (0xff < sVar5);
        puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[8] - (0xff < sVar6);
        puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[10] - (0xff < sVar7);
        puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[0xc] - (0xff < sVar8);
        puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[0xe] - (0xff < sVar9);
        puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar21[0] - (0xff < sVar10);
        puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar21[2] - (0xff < sVar11);
        puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar21[4] - (0xff < sVar12);
        puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar21[6] - (0xff < sVar13);
        puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar21[8] - (0xff < sVar14);
        puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar21[10] - (0xff < sVar15);
        puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar21[0xc] - (0xff < sVar16);
        puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar21[0xe] - (0xff < sVar17);
        lVar19 = lVar19 + 0x10;
      } while (lVar19 < w);
    }
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_m0_b = xx_loadu_128(mask + c);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}